

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFoo(TestMoreStuffImpl *this,CallFooContext context)

{
  uint uVar1;
  TestMoreStuffImpl *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int in_R8D;
  Promise<void> PVar2;
  TestMoreStuffImpl *local_108;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_100;
  Maybe<capnp::MessageSize> local_b8;
  undefined1 local_a0 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Client cap;
  Reader params;
  TestMoreStuffImpl *this_local;
  CallFooContext context_local;
  size_t __n;
  
  uVar1 = *(uint *)context.hook[1]._vptr_CallContextHook + 1;
  __n = (size_t)uVar1;
  *(uint *)context.hook[1]._vptr_CallContextHook = uVar1;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  ::getParams((Reader *)&cap.field_0x10,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::CallFooParams::Reader::getCap
            ((Client *)&request.hook.ptr,(Reader *)&cap.field_0x10);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_b8,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_a0,(Client *)&request.hook.ptr,&local_b8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_b8);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_a0,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_a0,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_100,(int)local_a0,__buf,__n,in_R8D);
  local_108 = this_local;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>::
  then<capnp::_::TestMoreStuffImpl::callFoo(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,capnproto_test::capnp::test::TestMoreStuff::CallFooResults>)::__0,kj::_::PropagateException>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>> *)
             this,(Type *)&local_100,(PropagateException *)&local_108);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_100);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_a0);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)&request.hook.ptr);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFoo(CallFooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());
        context.getResults().setS("bar");
      }